

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::HlslParseContext::handleRegister
          (HlslParseContext *this,TSourceLoc *loc,TQualifier *qualifier,TString *profile,
          TString *desc,int subComponent,TString *spaceDesc)

{
  size_type __n;
  TIntermediate *pTVar1;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  pointer pbVar9;
  _func_int *UNRECOVERED_JUMPTABLE;
  uint uVar10;
  ulong uVar11;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_58;
  
  if (profile != (TString *)0x0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
              (this,loc,"ignoring shader_profile","register","");
  }
  __n = desc->_M_string_length;
  if (__n == 1) {
    iVar4 = 0;
LAB_0041c3a1:
    pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    uVar10 = (uint)*(desc->_M_dataplus)._M_p;
    iVar5 = tolower(uVar10);
    if ((iVar5 - 0x73U < 3) || (iVar5 == 0x62)) {
      if ((short)(*(ulong *)&qualifier->field_0x1c >> 0x20) == -1) {
        *(ulong *)&qualifier->field_0x1c =
             *(ulong *)&qualifier->field_0x1c & 0xffff0000ffffffff |
             (ulong)(iVar4 + subComponent & 0xffff) << 0x20;
      }
      pbVar9 = (pTVar1->resourceSetBinding).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (pTVar1->resourceSetBinding).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar6 = (long)pbVar2 - (long)pbVar9;
      if ((ulong)((lVar6 >> 5) * -0x5555555555555555) < 0x5555555555555556 && lVar6 != 0) {
        pcVar8 = (desc->_M_dataplus)._M_p;
        do {
          iVar4 = strcmp(pcVar8,(pbVar9->_M_dataplus)._M_p);
          if (iVar4 == 0) {
            uVar10 = atoi(pbVar9[1]._M_dataplus._M_p);
            uVar11 = *(ulong *)&qualifier->field_0x1c;
            uVar7 = (ulong)((uVar10 & 0x7f) << 0xf);
            *(ulong *)&qualifier->field_0x1c = uVar11 & 0xffffffffffc07fff | uVar7;
            iVar4 = atoi(pbVar9[2]._M_dataplus._M_p);
            *(ulong *)&qualifier->field_0x1c =
                 uVar11 & 0xffff0000ffc07fff | uVar7 |
                 (ulong)(iVar4 + subComponent & 0xffff) << 0x20;
            break;
          }
          pbVar9 = pbVar9 + 3;
        } while (pbVar9 != pbVar2);
      }
    }
    else if (iVar5 == 99) {
      qualifier->layoutOffset = iVar4 << 4;
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                (this,loc,"ignoring unrecognized register type","register","%c",(ulong)uVar10);
    }
    if ((spaceDesc != (TString *)0x0) && ((*(uint *)&qualifier->field_0x1c & 0x3f8000) == 0x1f8000))
    {
      if (spaceDesc->_M_string_length < 6) {
        uVar11 = 0;
        bVar3 = false;
      }
      else {
        uVar11 = 0;
        iVar4 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (spaceDesc,0,5,"space");
        bVar3 = false;
        if (iVar4 == 0) {
          if ((int)(spaceDesc->_M_dataplus)._M_p[5] - 0x30U < 10) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::substr(&local_58,spaceDesc,5,spaceDesc->_M_string_length);
            uVar10 = atoi(local_58._M_dataplus._M_p);
            uVar11 = (ulong)((uVar10 & 0x7f) << 0xf);
            bVar3 = true;
          }
          else {
            uVar11 = 0;
            bVar3 = false;
          }
        }
      }
      if (bVar3) {
        *(ulong *)&qualifier->field_0x1c =
             *(ulong *)&qualifier->field_0x1c & 0xffffffffffc07fff | uVar11;
      }
      else {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"expected spaceN","register","");
      }
    }
    return;
  }
  if (__n == 0) {
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    pcVar8 = "expected register type";
  }
  else {
    if ((int)(desc->_M_dataplus)._M_p[1] - 0x30U < 10) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      substr(&local_58,desc,1,__n);
      iVar4 = atoi(local_58._M_dataplus._M_p);
      goto LAB_0041c3a1;
    }
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    pcVar8 = "expected register number after register type";
  }
  (*UNRECOVERED_JUMPTABLE)(this,loc,pcVar8,"register","",UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void HlslParseContext::handleRegister(const TSourceLoc& loc, TQualifier& qualifier, const glslang::TString* profile,
                                      const glslang::TString& desc, int subComponent, const glslang::TString* spaceDesc)
{
    if (profile != nullptr)
        warn(loc, "ignoring shader_profile", "register", "");

    if (desc.size() < 1) {
        error(loc, "expected register type", "register", "");
        return;
    }

    int regNumber = 0;
    if (desc.size() > 1) {
        if (isdigit(desc[1]))
            regNumber = atoi(desc.substr(1, desc.size()).c_str());
        else {
            error(loc, "expected register number after register type", "register", "");
            return;
        }
    }

    // more information about register types see
    // https://docs.microsoft.com/en-us/windows/desktop/direct3dhlsl/dx-graphics-hlsl-variable-register
    const std::vector<std::string>& resourceInfo = intermediate.getResourceSetBinding();
    switch (std::tolower(desc[0])) {
    case 'c':
        // c register is the register slot in the global const buffer
        // each slot is a vector of 4 32 bit components
        qualifier.layoutOffset = regNumber * 4 * 4;
        break;
        // const buffer register slot
    case 'b':
        // textrues and structured buffers
    case 't':
        // samplers
    case 's':
        // uav resources
    case 'u':
        // if nothing else has set the binding, do so now
        // (other mechanisms override this one)
        if (!qualifier.hasBinding())
            qualifier.layoutBinding = regNumber + subComponent;

        // This handles per-register layout sets numbers.  For the global mode which sets
        // every symbol to the same value, see setLinkageLayoutSets().
        if ((resourceInfo.size() % 3) == 0) {
            // Apply per-symbol resource set and binding.
            for (auto it = resourceInfo.cbegin(); it != resourceInfo.cend(); it = it + 3) {
                if (strcmp(desc.c_str(), it[0].c_str()) == 0) {
                    qualifier.layoutSet = atoi(it[1].c_str());
                    qualifier.layoutBinding = atoi(it[2].c_str()) + subComponent;
                    break;
                }
            }
        }
        break;
    default:
        warn(loc, "ignoring unrecognized register type", "register", "%c", desc[0]);
        break;
    }

    // space
    unsigned int setNumber;
    const auto crackSpace = [&]() -> bool {
        const int spaceLen = 5;
        if (spaceDesc->size() < spaceLen + 1)
            return false;
        if (spaceDesc->compare(0, spaceLen, "space") != 0)
            return false;
        if (! isdigit((*spaceDesc)[spaceLen]))
            return false;
        setNumber = atoi(spaceDesc->substr(spaceLen, spaceDesc->size()).c_str());
        return true;
    };

    // if nothing else has set the set, do so now
    // (other mechanisms override this one)
    if (spaceDesc && !qualifier.hasSet()) {
        if (! crackSpace()) {
            error(loc, "expected spaceN", "register", "");
            return;
        }
        qualifier.layoutSet = setNumber;
    }
}